

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_repeat::build_graph(test_repeat *this,ggml_context *ctx)

{
  const_reference pvVar1;
  const_reference pvVar2;
  test_case *this_00;
  long ne3;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  test_case *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  ggml_tensor *src;
  ggml_tensor *target;
  size_type in_stack_ffffffffffffff68;
  array<long,_4UL> *in_stack_ffffffffffffff70;
  int64_t *ne;
  value_type_conflict3 ne1;
  ggml_context *ctx_00;
  test_case *this_01;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar5;
  
  uVar5 = *(undefined4 *)(in_RDI + 0x38);
  this_01 = in_RSI;
  pvVar1 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ne = (int64_t *)*pvVar1;
  pvVar2 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00 = (test_case *)((long)ne * (long)*pvVar2);
  pvVar1 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ne1 = *pvVar1;
  std::array<int,_4UL>::operator[]
            ((array<int,_4UL> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pvVar1 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ctx_00 = (ggml_context *)*pvVar1;
  pvVar2 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ne3 = (long)ctx_00 * (long)*pvVar2;
  std::array<long,_4UL>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::array<int,_4UL>::operator[]
            ((array<int,_4UL> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pgVar3 = test_case::ggml_new_tensor_4d
                     (this_00,(ggml_context *)CONCAT44(uVar5,in_stack_ffffffffffffff98),
                      (ggml_type)((ulong)this_01 >> 0x20),(int64_t)ctx_00,ne1,(int64_t)ne,ne3);
  ggml_set_name(pgVar3,"target");
  std::array<long,_4UL>::data((array<long,_4UL> *)0x18e678);
  pgVar4 = test_case::ggml_new_tensor(this_01,ctx_00,(ggml_type)((ulong)ne1 >> 0x20),(int)ne1,ne);
  ggml_set_param(in_RSI,pgVar4);
  ggml_set_name(pgVar4,"src");
  pgVar3 = (ggml_tensor *)ggml_repeat(in_RSI,pgVar4,pgVar3);
  ggml_set_name(pgVar3,"out");
  return pgVar3;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * target = ggml_new_tensor_4d(ctx, type, ne[0]*nr[0], ne[1]*nr[1], ne[2]*nr[2], ne[3]*nr[3]);
        ggml_set_name(target, "target");

        ggml_tensor * src = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, src);
        ggml_set_name(src, "src");

        ggml_tensor * out = ggml_repeat(ctx, src, target);
        ggml_set_name(out, "out");

        return out;
    }